

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void cxxopts::values::parse_value<unsigned_int>
               (string *text,vector<unsigned_int,_std::allocator<unsigned_int>_> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  istream *piVar2;
  uint v;
  string token;
  stringstream in;
  uint local_1d4;
  string local_1d0;
  long local_1b0 [4];
  byte abStack_190 [96];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0,(string *)text,_S_out|_S_in);
  paVar1 = &local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 2) == 0) {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_1d0,',');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      integer_parser<unsigned_int>(&local_1d0,&local_1d4);
      __position._M_current =
           (value->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (value->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (value,__position,&local_1d4);
      }
      else {
        *__position._M_current = local_1d4;
        (value->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 2) == 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }